

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O2

long testSerializeHeartbeat(int count)

{
  long lVar1;
  long lVar2;
  int iVar3;
  bool bVar4;
  string local_1a8 [32];
  Heartbeat message;
  
  FIX42::Heartbeat::Heartbeat(&message);
  lVar1 = GetTickCount();
  iVar3 = 0;
  if (0 < count) {
    iVar3 = count;
  }
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    FIX::Message::toString_abi_cxx11_((int)local_1a8,(int)&message,8);
    std::__cxx11::string::~string(local_1a8);
  }
  lVar2 = GetTickCount();
  FIX::Message::~Message((Message *)&message);
  return lVar2 - lVar1;
}

Assistant:

long testSerializeHeartbeat(int count) {
  FIX42::Heartbeat message;
  count = count - 1;

  long start = GetTickCount();
  for (int i = 0; i <= count; ++i) {
    message.toString();
  }
  return GetTickCount() - start;
}